

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

int D_PickRandomTeam(void)

{
  FTeam *pFVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  FTeam *pFVar6;
  long lVar7;
  int iVar8;
  userinfo_t *this;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  int i;
  int iVar12;
  
  pFVar6 = Teams.Array;
  uVar5 = (ulong)Teams.Count;
  for (lVar7 = 0; uVar5 * 0x38 - lVar7 != 0; lVar7 = lVar7 + 0x38) {
    *(undefined8 *)((long)&pFVar6->m_iPresent + lVar7) = 0;
  }
  this = (userinfo_t *)&DAT_017dbfb8;
  iVar12 = 0;
  for (lVar7 = 0; pFVar6 = Teams.Array, lVar7 != 8; lVar7 = lVar7 + 1) {
    if (playeringame[lVar7] == true) {
      uVar4 = userinfo_t::GetTeam(this);
      bVar3 = FTeam::IsValidTeam(&TeamLibrary,uVar4);
      if (bVar3) {
        iVar8 = Teams.Array[(int)uVar4].m_iPresent;
        Teams.Array[(int)uVar4].m_iPresent = iVar8 + 1;
        iVar12 = iVar12 + (uint)(iVar8 == 0);
      }
    }
    this = this + 0x1c;
  }
  if (iVar12 < 2) {
    do {
      uVar4 = FRandom::operator()(&pr_pickteam);
      uVar4 = uVar4 % Teams.Count;
    } while (Teams.Array[(int)uVar4].m_iPresent != 0);
  }
  else {
    uVar5 = (ulong)Teams.Count;
    piVar9 = &(Teams.Array)->m_iPresent;
    iVar12 = 0x7fffffff;
    iVar8 = 0;
    for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
      iVar11 = *piVar9;
      if (0 < iVar11) {
        pFVar1 = pFVar6;
        iVar2 = 0;
        if (iVar12 <= iVar11) {
          if (iVar11 != iVar12) goto LAB_0038bd74;
          pFVar1 = pFVar6 + (iVar8 + 1);
          iVar11 = iVar12;
          iVar2 = iVar8 + 1;
        }
        iVar8 = iVar2;
        pFVar1->m_iTies = (int)uVar10;
        iVar12 = iVar11;
      }
LAB_0038bd74:
      piVar9 = piVar9 + 0xe;
    }
    pFVar6 = Teams.Array;
    if (iVar8 != 0) {
      iVar12 = FRandom::operator()(&pr_pickteam);
      pFVar6 = Teams.Array + iVar12 % (iVar8 + 1);
    }
    uVar4 = pFVar6->m_iTies;
  }
  return uVar4;
}

Assistant:

int D_PickRandomTeam ()
{
	for (unsigned int i = 0; i < Teams.Size (); i++)
	{
		Teams[i].m_iPresent = 0;
		Teams[i].m_iTies = 0;
	}

	int numTeams = 0;
	int team;

	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			team = players[i].userinfo.GetTeam();
			if (TeamLibrary.IsValidTeam(team))
			{
				if (Teams[team].m_iPresent++ == 0)
				{
					numTeams++;
				}
			}
		}
	}

	if (numTeams < 2)
	{
		do
		{
			team = pr_pickteam() % Teams.Size();
		} while (Teams[team].m_iPresent != 0);
	}
	else
	{
		int lowest = INT_MAX, lowestTie = 0;
		unsigned int i;

		for (i = 0; i < Teams.Size (); ++i)
		{
			if (Teams[i].m_iPresent > 0)
			{
				if (Teams[i].m_iPresent < lowest)
				{
					lowest = Teams[i].m_iPresent;
					lowestTie = 0;
					Teams[0].m_iTies = i;
				}
				else if (Teams[i].m_iPresent == lowest)
				{
					Teams[++lowestTie].m_iTies = i;
				}
			}
		}
		if (lowestTie == 0)
		{
			team = Teams[0].m_iTies;
		}
		else
		{
			team = Teams[pr_pickteam() % (lowestTie+1)].m_iTies;
		}
	}

	return team;
}